

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcGeometricRepresentationSubContext::~IfcGeometricRepresentationSubContext
          (IfcGeometricRepresentationSubContext *this,void **vtt)

{
  _func_int **pp_Var1;
  
  pp_Var1 = (_func_int **)*vtt;
  (this->super_IfcGeometricRepresentationContext).super_IfcRepresentationContext.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>._vptr_ObjectHelper =
       pp_Var1;
  *(void **)((long)&(this->super_IfcGeometricRepresentationContext).super_IfcRepresentationContext.
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationContext,_2UL>.
                    _vptr_ObjectHelper + (long)pp_Var1[-3]) = vtt[0xc];
  *(void **)&(this->super_IfcGeometricRepresentationContext).super_IfcRepresentationContext.
             field_0x60 = vtt[0xd];
  *(void **)&(this->super_IfcGeometricRepresentationContext).field_0xa8 = vtt[0xe];
  std::__cxx11::string::~string((string *)&this->UserDefinedTargetView);
  std::__cxx11::string::~string((string *)&this->TargetView);
  IfcGeometricRepresentationContext::~IfcGeometricRepresentationContext
            (&this->super_IfcGeometricRepresentationContext,vtt + 1);
  return;
}

Assistant:

IfcGeometricRepresentationSubContext() : Object("IfcGeometricRepresentationSubContext") {}